

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  Rune lo;
  Rune hi;
  CharClass *pCVar2;
  Rune *pRVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Rune *pRVar8;
  CharClassBuilder ccb;
  Regexp *re;
  int local_23c;
  long local_238;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_230;
  Regexp *local_228;
  long local_220;
  ulong local_218;
  string local_210;
  CharClassBuilder local_1f0;
  LogMessage local_1b0;
  
  lVar5 = (long)nsub;
  uVar7 = 0;
  local_228 = (Regexp *)0x0;
  uVar6 = 0;
  local_238 = lVar5;
  local_230 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  do {
    if (lVar5 < (long)uVar7) {
      return;
    }
    pRVar1 = local_228;
    if ((((lVar5 <= (long)uVar7) || (pRVar1 = sub[uVar7], local_228 == (Regexp *)0x0)) ||
        ((local_228->op_ != '\x14' && (local_228->op_ != '\x03')))) ||
       ((pRVar1->op_ != '\x03' && (pRVar1->op_ != '\x14')))) {
      local_228 = pRVar1;
      if (uVar7 != (int)uVar6 + 1 && uVar7 != uVar6) {
        CharClassBuilder::CharClassBuilder(&local_1f0);
        lVar5 = (long)(int)uVar6;
        local_220 = lVar5;
        local_218 = uVar6;
        for (; lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
          pRVar1 = sub[lVar5];
          if (pRVar1->op_ == '\x03') {
            lo = Regexp::rune(pRVar1);
            hi = Regexp::rune(pRVar1);
            CharClassBuilder::AddRangeFlags(&local_1f0,lo,hi,(uint)pRVar1->parse_flags_);
          }
          else {
            if (pRVar1->op_ != '\x14') {
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/parse.cc"
                         ,0x4a1);
              poVar4 = std::operator<<((ostream *)&local_1b0.str_,"RE2: unexpected op: ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)pRVar1->op_);
              poVar4 = std::operator<<(poVar4," ");
              Regexp::ToString_abi_cxx11_(&local_210,pRVar1);
              std::operator<<(poVar4,(string *)&local_210);
              std::__cxx11::string::~string((string *)&local_210);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
            }
            pCVar2 = Regexp::cc(pRVar1);
            pRVar3 = *(Rune **)(pCVar2 + 8);
            for (pRVar8 = pRVar3; pRVar8 != pRVar3 + (long)*(int *)(pCVar2 + 0x10) * 2;
                pRVar8 = pRVar8 + 2) {
              CharClassBuilder::AddRange(&local_1f0,*pRVar8,pRVar8[1]);
              pRVar3 = *(Rune **)(pCVar2 + 8);
            }
          }
          Regexp::Decref(pRVar1);
        }
        pCVar2 = CharClassBuilder::GetCharClass(&local_1f0);
        local_1b0._0_8_ = Regexp::NewCharClass(pCVar2,flags);
        uVar6 = local_218;
        local_210._M_dataplus._M_p = (pointer)(sub + local_220);
        local_23c = (int)uVar7 - (int)local_218;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>
                  (local_230,(Regexp **)&local_1b0,(Regexp ***)&local_210,&local_23c);
        std::
        _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
        ::~_Rb_tree(&local_1f0.ranges_._M_t);
        lVar5 = local_238;
      }
      uVar6 = uVar6 & 0xffffffff;
      if ((long)uVar7 < lVar5) {
        uVar6 = uVar7 & 0xffffffff;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}